

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall
CTPNStmFinally::gen_code_finally
          (CTPNStmFinally *this,ulong start_prot_ofs,ulong end_prot_ofs,CTPNStmTry *try_stm)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong catch_block_ofs;
  CTPNStmEnclosing *pCVar4;
  CTPNStm *substm;
  CTcGenTarg *pCVar5;
  CTcGenTarg *pCVar6;
  uint16_t tmp;
  undefined8 in_RAX;
  size_t __n;
  char buf [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  catch_block_ofs = (G_cs->super_CTcDataStream).ofs_;
  pCVar4 = G_cs->enclosing_;
  G_cs->enclosing_ = (CTPNStmEnclosing *)this;
  CTcT3ExcTable::add_catch(&G_cg->exc_table_,start_prot_ofs,end_prot_ofs,0,catch_block_ofs);
  pCVar5 = G_cg;
  pCVar5->last_op_ = 0xf2;
  pCVar6 = G_cg;
  pCVar5->second_last_op_ = 0xf2;
  iVar2 = G_cg->sp_depth_;
  iVar3 = iVar2 + 1;
  G_cg->sp_depth_ = iVar3;
  if (pCVar6->max_sp_depth_ <= iVar2) {
    pCVar6->max_sp_depth_ = iVar3;
  }
  CTcSymLocal::s_gen_code_setlcl_stk((this->super_CTPNStmFinallyBase).exc_local_id_,0);
  CTPNStmTry::gen_jsr_finally(try_stm);
  CTcSymLocal::s_gen_code_getlcl((this->super_CTPNStmFinallyBase).exc_local_id_,0);
  CTcGenTarg::write_op(G_cg,0xb8);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  CTcPrsNode::def_label_pos(try_stm->finally_lbl_);
  pCVar5 = G_cg;
  iVar3 = G_cg->sp_depth_;
  uVar1 = iVar3 + 1;
  __n = (size_t)uVar1;
  G_cg->sp_depth_ = uVar1;
  if (pCVar5->max_sp_depth_ <= iVar3) {
    pCVar5->max_sp_depth_ = uVar1;
  }
  CTcSymLocal::s_gen_code_setlcl_stk((this->super_CTPNStmFinallyBase).jsr_local_id_,0);
  substm = (this->super_CTPNStmFinallyBase).body_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  CTcGenTarg::write_op(G_cg,0x9d);
  uStack_38 = CONCAT26((short)(this->super_CTPNStmFinallyBase).jsr_local_id_,(undefined6)uStack_38);
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 6,(void *)0x2,__n);
  G_cs->enclosing_ = pCVar4;
  return;
}

Assistant:

void CTPNStmFinally::gen_code_finally(ulong start_prot_ofs,
                                      ulong end_prot_ofs,
                                      CTPNStmTry *try_stm)
{
    CTPNStmEnclosing *old_enclosing;

    /* 
     *   set the source location for our prolog code to the 'finally'
     *   clause's start 
     */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* 
     *   add our exception table entry - use the invalid object ID as a
     *   special flag to indicate that we catch all exceptions 
     */
    G_cg->get_exc_table()->add_catch(start_prot_ofs, end_prot_ofs,
                                     VM_INVALID_OBJ, G_cs->get_ofs());

    /* don't allow any peephole optimizations to affect this offset */
    G_cg->clear_peephole();

    /* the VM pushes the exception onto the stack before calling us */
    G_cg->note_push();

    /*
     *   When we get called due to an exception, we want to run the
     *   'finally' code block and then re-throw the exception.  First, store
     *   the exception parameter in our special local stack slot that we
     *   allocated specifically for the purpose of being a temporary holder
     *   for this value.  
     */
    CTcSymLocal::s_gen_code_setlcl_stk(exc_local_id_, FALSE);

    /* call the 'finally' block */
    try_stm->gen_jsr_finally();

    /*
     *   After the 'finally' block returns, we must re-throw the
     *   exception.  Retrieve the contents of our local where we stashed
     *   the exception object and re-throw the exception.  
     */
    CTcSymLocal::s_gen_code_getlcl(exc_local_id_, FALSE);

    /* re-throw the exception - this pops the exception object */
    G_cg->write_op(OPC_THROW);
    G_cg->note_pop();

    /* 
     *   set the source location to the 'finally' clause once again, since
     *   we changed the source location in the course of generating the
     *   catch-all handler 
     */
    add_debug_line_rec();

    /* this is where the 'finally' code block begins - define our label */
    def_label_pos(try_stm->get_finally_lbl());

    /*
     *   The 'finally' block is the target of LJSR instructions, since we
     *   must run the 'finally' block's code from numerous code paths.
     *   The first thing we must do is pop the return address and stash it
     *   in a local variable.  (We note an extra push, since the LJSR will
     *   have pushed the value before transferring control here.)
     */
    G_cg->note_push();
    CTcSymLocal::s_gen_code_setlcl_stk(jsr_local_id_, FALSE);
    
    /* generate the code block, if there is one */
    if (body_ != 0)
        gen_code_substm(body_);

    /* return from the 'finally' subroutine */
    G_cg->write_op(OPC_LRET);
    G_cs->write2(jsr_local_id_);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}